

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerGLSL::check_atomic_image(CompilerGLSL *this,uint32_t id)

{
  StorageClass SVar1;
  bool bVar2;
  SPIRType *pSVar3;
  SPIRVariable *pSVar4;
  allocator local_41;
  string local_40;
  
  pSVar3 = Compiler::expression_type(&this->super_Compiler,id);
  SVar1 = pSVar3->storage;
  if (SVar1 == StorageClassImage) {
    if (((this->options).es == true) && ((this->options).version < 0x140)) {
      ::std::__cxx11::string::string((string *)&local_40,"GL_OES_shader_image_atomic",&local_41);
      require_extension_internal(this,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    pSVar4 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id);
    if (pSVar4 != (SPIRVariable *)0x0) {
      bVar2 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,
                         DecorationNonWritable);
      if (!bVar2) {
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,
                           DecorationNonReadable);
        if (!bVar2) goto LAB_002818d7;
      }
      Compiler::unset_decoration
                (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,DecorationNonWritable);
      Compiler::unset_decoration
                (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,DecorationNonReadable);
      Compiler::force_recompile(&this->super_Compiler);
    }
  }
LAB_002818d7:
  return SVar1 == StorageClassImage;
}

Assistant:

bool CompilerGLSL::check_atomic_image(uint32_t id)
{
	auto &type = expression_type(id);
	if (type.storage == StorageClassImage)
	{
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_shader_image_atomic");

		auto *var = maybe_get_backing_variable(id);
		if (var)
		{
			if (has_decoration(var->self, DecorationNonWritable) || has_decoration(var->self, DecorationNonReadable))
			{
				unset_decoration(var->self, DecorationNonWritable);
				unset_decoration(var->self, DecorationNonReadable);
				force_recompile();
			}
		}
		return true;
	}
	else
		return false;
}